

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.hpp
# Opt level: O0

digest32<160L> * __thiscall
libtorrent::digest32<160L>::operator~(digest32<160L> *__return_storage_ptr__,digest32<160L> *this)

{
  uint uVar1;
  type_conflict4 tVar2;
  const_type puVar3;
  const_type puVar4;
  array<unsigned_int,_5UL> *in_RCX;
  digest32<160L> *ret;
  reference v;
  zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  __end0;
  zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  __begin0;
  combined_range<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  *__range2;
  digest32<160L> *this_local;
  
  digest32(__return_storage_ptr__);
  boost::range::combine<std::array<unsigned_int,5ul>const&,std::array<unsigned_int,5ul>&>
            ((combined_range<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
              *)&__begin0.m_iterator_tuple.super_type.tail,(range *)this,
             &__return_storage_ptr__->m_number,in_RCX);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__end0.m_iterator_tuple.super_type.tail);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
         *)&v.tail);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long>
                        *)&__end0.m_iterator_tuple.super_type.tail,
                       (iterator_facade<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long>
                        *)&v.tail);
    if (!tVar2) break;
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
                 *)&ret);
    puVar3 = boost::tuples::
             get<0,unsigned_int_const&,boost::tuples::cons<unsigned_int&,boost::tuples::null_type>>
                       ((cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>
                         *)&ret);
    uVar1 = *puVar3;
    puVar4 = boost::tuples::
             get<1,unsigned_int_const&,boost::tuples::cons<unsigned_int&,boost::tuples::null_type>>
                       ((cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>
                         *)&ret);
    *puVar4 = ~uVar1;
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
                  *)&__end0.m_iterator_tuple.super_type.tail);
  }
  return __return_storage_ptr__;
}

Assistant:

digest32 operator~() const noexcept
		{
			digest32 ret;
			for (auto const v : boost::combine(m_number, ret.m_number))
				boost::get<1>(v) = ~boost::get<0>(v);
			return ret;
		}